

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.h
# Opt level: O3

BBox3fa * __thiscall
embree::sse2::BVHNRefitT<4,_embree::QuadMesh,_embree::QuadMv<4>_>::leafBounds
          (BBox3fa *__return_storage_ptr__,BVHNRefitT<4,_embree::QuadMesh,_embree::QuadMv<4>_> *this
          ,NodeRef *ref)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  ulong uVar6;
  QuadMesh *pQVar7;
  long lVar8;
  char *pcVar9;
  size_t sVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined8 *puVar17;
  long lVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vuint<4> vprimID;
  vuint<4> vgeomID;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  uint local_58 [10];
  
  aVar12 = _DAT_01f7aa00;
  aVar11 = _DAT_01f7a9f0;
  uVar6 = ref->ptr;
  if (uVar6 == 8) {
    *(undefined8 *)&(__return_storage_ptr__->lower).field_0 = 0x7f8000007f800000;
    *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = 0x7f8000007f800000;
    *(undefined8 *)&(__return_storage_ptr__->upper).field_0 = 0xff800000ff800000;
    *(undefined8 *)((long)&(__return_storage_ptr__->upper).field_0 + 8) = 0xff800000ff800000;
  }
  else {
    uVar13 = (ulong)((uint)uVar6 & 0xf);
    aVar19 = _DAT_01f7a9f0;
    aVar20 = _DAT_01f7aa00;
    if (uVar13 != 8) {
      lVar15 = (uVar6 & 0xfffffffffffffff0) + 0xd0;
      lVar16 = 0;
      do {
        puVar17 = (undefined8 *)(lVar16 * 0xe0 + (uVar6 & 0xfffffffffffffff0));
        pQVar7 = this->mesh;
        local_58[4] = 0xffffffff;
        local_58[5] = 0xffffffff;
        local_58[6] = 0xffffffff;
        local_58[7] = 0xffffffff;
        local_58[0] = 0xffffffff;
        local_58[1] = 0xffffffff;
        local_58[2] = 0xffffffff;
        local_58[3] = 0xffffffff;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_88 = 0;
        uStack_80 = 0;
        local_98 = 0;
        uStack_90 = 0;
        local_a8 = 0;
        uStack_a0 = 0;
        local_b8 = 0;
        uStack_b0 = 0;
        local_c8 = 0;
        uStack_c0 = 0;
        local_d8 = 0;
        uStack_d0 = 0;
        local_e8 = 0;
        uStack_e0 = 0;
        lVar14 = 0;
        aVar21 = aVar11;
        aVar22 = aVar12;
        do {
          uVar5 = *(uint *)(lVar15 + lVar14);
          if ((ulong)uVar5 == 0xffffffff) break;
          lVar18 = (ulong)uVar5 * *(long *)&pQVar7->field_0x68;
          lVar8 = *(long *)&(pQVar7->super_Geometry).field_0x58;
          pcVar9 = (pQVar7->vertices0).super_RawBufferView.ptr_ofs;
          sVar10 = (pQVar7->vertices0).super_RawBufferView.stride;
          auVar1 = *(undefined1 (*) [16])(pcVar9 + *(uint *)(lVar8 + lVar18) * sVar10);
          auVar2 = *(undefined1 (*) [16])(pcVar9 + *(uint *)(lVar8 + 4 + lVar18) * sVar10);
          auVar3 = *(undefined1 (*) [16])(pcVar9 + *(uint *)(lVar8 + 8 + lVar18) * sVar10);
          auVar4 = *(undefined1 (*) [16])(pcVar9 + *(uint *)(lVar8 + 0xc + lVar18) * sVar10);
          auVar23 = minps(auVar1,auVar2);
          auVar24 = maxps(auVar1,auVar2);
          auVar25 = minps(auVar3,auVar4);
          auVar23 = minps(auVar23,auVar25);
          auVar25 = maxps(auVar3,auVar4);
          auVar24 = maxps(auVar24,auVar25);
          aVar21.m128 = (__m128)minps(aVar21.m128,auVar23);
          aVar22.m128 = (__m128)maxps(aVar22.m128,auVar24);
          *(undefined4 *)((long)local_58 + lVar14 + 0x10) = *(undefined4 *)(lVar15 + -0x10 + lVar14)
          ;
          *(uint *)((long)local_58 + lVar14) = uVar5;
          *(int *)((long)&local_88 + lVar14) = auVar1._0_4_;
          *(int *)((long)&local_78 + lVar14) = auVar1._4_4_;
          *(int *)((long)&local_68 + lVar14) = auVar1._8_4_;
          *(int *)((long)&local_b8 + lVar14) = auVar2._0_4_;
          *(int *)((long)&local_a8 + lVar14) = auVar2._4_4_;
          *(int *)((long)&local_98 + lVar14) = auVar2._8_4_;
          *(int *)((long)&local_e8 + lVar14) = auVar3._0_4_;
          *(int *)((long)&local_d8 + lVar14) = auVar3._4_4_;
          *(int *)((long)&local_c8 + lVar14) = auVar3._8_4_;
          *(int *)(lVar15 + -0x40 + lVar14) = auVar4._0_4_;
          *(int *)(lVar15 + -0x30 + lVar14) = auVar4._4_4_;
          *(int *)(lVar15 + -0x20 + lVar14) = auVar4._8_4_;
          lVar14 = lVar14 + 4;
        } while (lVar14 != 0x10);
        aVar20.m128 = (__m128)maxps(aVar20.m128,aVar22.m128);
        aVar19.m128 = (__m128)minps(aVar19.m128,aVar21.m128);
        *puVar17 = local_88;
        puVar17[1] = uStack_80;
        puVar17[2] = local_78;
        puVar17[3] = uStack_70;
        puVar17[4] = local_68;
        puVar17[5] = uStack_60;
        puVar17[6] = local_b8;
        puVar17[7] = uStack_b0;
        puVar17[8] = local_a8;
        puVar17[9] = uStack_a0;
        puVar17[10] = local_98;
        puVar17[0xb] = uStack_90;
        puVar17[0xc] = local_e8;
        puVar17[0xd] = uStack_e0;
        puVar17[0xe] = local_d8;
        puVar17[0xf] = uStack_d0;
        puVar17[0x10] = local_c8;
        puVar17[0x11] = uStack_c0;
        puVar17[0x18] = CONCAT44(local_58[5],local_58[4]);
        puVar17[0x19] = CONCAT44(local_58[7],local_58[6]);
        puVar17[0x1a] = CONCAT44(local_58[1],local_58[0]);
        puVar17[0x1b] = CONCAT44(local_58[3],local_58[2]);
        lVar16 = lVar16 + 1;
        lVar15 = lVar15 + 0xe0;
      } while (lVar16 != uVar13 - 8);
    }
    (__return_storage_ptr__->lower).field_0 = aVar19;
    (__return_storage_ptr__->upper).field_0 = aVar20;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual const BBox3fa leafBounds (NodeRef& ref) const
      {
        size_t num; char* prim = ref.leaf(num);
        if (unlikely(ref == BVH::emptyNode)) return empty;

        BBox3fa bounds = empty;
        for (size_t i=0; i<num; i++)
            bounds.extend(((Primitive*)prim)[i].update(mesh));
        return bounds;
      }